

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

text * lest::pluralise(text *__return_storage_ptr__,text *word,int n)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [36];
  int local_1c;
  text *ptStack_18;
  int n_local;
  text *word_local;
  
  local_1c = n;
  ptStack_18 = word;
  word_local = __return_storage_ptr__;
  if (n != 1) {
    std::operator+(&local_60,word,"s");
    std::__cxx11::string::string(local_40,(string *)&local_60);
  }
  else {
    std::__cxx11::string::string(local_40,(string *)word);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_40);
  std::__cxx11::string::~string(local_40);
  if (n != 1) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

inline text pluralise( text word,int n )
{
    return n == 1 ? word : word + "s";
}